

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgGoogol.cpp
# Opt level: O2

dgGoogol * __thiscall
dgGoogol::operator+(dgGoogol *__return_storage_ptr__,dgGoogol *this,dgGoogol *A)

{
  short sVar1;
  HaI32 i;
  uint uVar2;
  HaI32 HVar3;
  ulong uVar4;
  int bits;
  short sVar5;
  ulong uVar6;
  dgGoogol *this_00;
  bool bVar7;
  undefined8 uVar8;
  HaU64 HVar9;
  HaU64 HVar10;
  HaU64 HVar11;
  HaU64 mantissa [4];
  HaU64 mantissa1 [4];
  HaU64 mantissa0 [4];
  
  dgGoogol(__return_storage_ptr__);
  if (A->m_mantissa[0] == 0 || this->m_mantissa[0] == 0) {
    if (A->m_mantissa[0] == 0) {
      __return_storage_ptr__->m_mantissa[3] = this->m_mantissa[3];
      uVar8._0_1_ = this->m_sign;
      uVar8._1_1_ = this->field_0x1;
      uVar8._2_2_ = this->m_exponent;
      uVar8._4_4_ = *(undefined4 *)&this->field_0x4;
      HVar9 = this->m_mantissa[0];
      HVar10 = this->m_mantissa[1];
      HVar11 = this->m_mantissa[2];
    }
    else {
      __return_storage_ptr__->m_mantissa[3] = A->m_mantissa[3];
      uVar8._0_1_ = A->m_sign;
      uVar8._1_1_ = A->field_0x1;
      uVar8._2_2_ = A->m_exponent;
      uVar8._4_4_ = *(undefined4 *)&A->field_0x4;
      HVar9 = A->m_mantissa[0];
      HVar10 = A->m_mantissa[1];
      HVar11 = A->m_mantissa[2];
    }
    __return_storage_ptr__->m_sign = (char)uVar8;
    __return_storage_ptr__->field_0x1 = (char)((ulong)uVar8 >> 8);
    __return_storage_ptr__->m_exponent = (short)((ulong)uVar8 >> 0x10);
    *(int *)&__return_storage_ptr__->field_0x4 = (int)((ulong)uVar8 >> 0x20);
    __return_storage_ptr__->m_mantissa[0] = HVar9;
    __return_storage_ptr__->m_mantissa[1] = HVar10;
    __return_storage_ptr__->m_mantissa[2] = HVar11;
  }
  else {
    CopySignedMantissa(this,mantissa0);
    this_00 = A;
    CopySignedMantissa(A,mantissa1);
    sVar5 = this->m_exponent;
    sVar1 = A->m_exponent;
    bits = (int)sVar5 - (int)sVar1;
    if (bits == 0 || (int)sVar5 < (int)sVar1) {
      if (bits < 0) {
        ShiftRightMantissa(this_00,mantissa0,-bits);
        sVar5 = sVar1;
      }
    }
    else {
      ShiftRightMantissa(this_00,mantissa1,bits);
    }
    uVar4 = 0;
    for (uVar2 = 3; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
      uVar6 = mantissa1[uVar2];
      bVar7 = CARRY8(uVar6,mantissa0[uVar2]);
      uVar6 = uVar6 + mantissa0[uVar2];
      this_00 = (dgGoogol *)CONCAT71((int7)((ulong)this_00 >> 8),bVar7);
      mantissa[uVar2] = uVar4 + uVar6;
      uVar4 = (ulong)(CARRY8(uVar4,uVar6) || bVar7);
    }
    bVar7 = (long)mantissa[0] < 0;
    if (bVar7) {
      NegateMantissa(this_00,mantissa);
    }
    HVar3 = NormalizeMantissa(this_00,mantissa);
    sVar5 = sVar5 + (short)HVar3;
    if (HVar3 < -0xff) {
      sVar5 = 0;
    }
    __return_storage_ptr__->m_sign = HVar3 >= -0xff && bVar7;
    __return_storage_ptr__->m_exponent = sVar5;
    __return_storage_ptr__->m_mantissa[0] = mantissa[0];
    __return_storage_ptr__->m_mantissa[1] = mantissa[1];
    __return_storage_ptr__->m_mantissa[2] = mantissa[2];
    __return_storage_ptr__->m_mantissa[3] = mantissa[3];
  }
  return __return_storage_ptr__;
}

Assistant:

dgGoogol dgGoogol::operator+ (const dgGoogol &A) const
{
	dgGoogol tmp;
	if (m_mantissa[0] && A.m_mantissa[0]) {
		hacd::HaU64 mantissa0[DG_GOOGOL_SIZE];
		hacd::HaU64 mantissa1[DG_GOOGOL_SIZE];
		hacd::HaU64 mantissa[DG_GOOGOL_SIZE];

		CopySignedMantissa (mantissa0);
		A.CopySignedMantissa (mantissa1);

		hacd::HaI32 exponetDiff = m_exponent - A.m_exponent;
		hacd::HaI32 exponent = m_exponent;
		if (exponetDiff > 0) {
			ShiftRightMantissa (mantissa1, exponetDiff);
		} else if (exponetDiff < 0) {
			exponent = A.m_exponent;
			ShiftRightMantissa (mantissa0, -exponetDiff);
		} 

		hacd::HaU64 carrier = 0;
		for (hacd::HaI32 i = DG_GOOGOL_SIZE - 1; i >= 0; i --) {
			hacd::HaU64 m0 = mantissa0[i];
			hacd::HaU64 m1 = mantissa1[i];
			mantissa[i] = m0 + m1 + carrier;
			carrier = CheckCarrier (m0, m1) | CheckCarrier (m0 + m1, carrier);
		}

		hacd::HaI8 sign = 0;
		if (hacd::HaI64 (mantissa[0]) < 0) {
			sign = 1;
			NegateMantissa (mantissa);
		}

		hacd::HaI32 bits = NormalizeMantissa (mantissa);
		if (bits <= (-64 * DG_GOOGOL_SIZE)) {
			tmp.m_sign = 0;
			tmp.m_exponent = 0;
		} else {
			tmp.m_sign = sign;
			tmp.m_exponent =  hacd::HaI16 (exponent + bits);
		}

		memcpy (tmp.m_mantissa, mantissa, sizeof (m_mantissa));
		

	} else if (A.m_mantissa[0]) {
		tmp = A;
	} else {
		tmp = *this;
	}

	return tmp;
}